

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

PulseStyleKind slang::ast::SemanticFacts::getPulseStyleKind(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (0xf6 < iVar1) {
    if (iVar1 == 0xf7) {
      return OnEvent;
    }
    return ShowCancelled;
  }
  if (iVar1 == 0xe1) {
    return NoShowCancelled;
  }
  return OnDetect;
}

Assistant:

PulseStyleKind SemanticFacts::getPulseStyleKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::PulseStyleOnEventKeyword: return PulseStyleKind::OnEvent;
        case TokenKind::PulseStyleOnDetectKeyword: return PulseStyleKind::OnDetect;
        case TokenKind::ShowCancelledKeyword: return PulseStyleKind::ShowCancelled;
        case TokenKind::NoShowCancelledKeyword: return PulseStyleKind::NoShowCancelled;
        default: SLANG_UNREACHABLE;
    }
}